

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapObjects.cpp
# Opt level: O2

RecyclableObject *
TTD::NSSnapObjects::DoObjectInflation_SnapHeapArgumentsInfo
          (SnapObject *snpObject,InflateMap *inflator)

{
  ScriptContext *pSVar1;
  SnapHeapArgumentsInfo *pSVar2;
  RecyclableObject *pRVar3;
  
  pSVar1 = InflateMap::LookupScriptContext(inflator,snpObject->SnapType->ScriptContextLogId);
  pSVar2 = SnapObjectGetAddtlInfoAs<TTD::NSSnapObjects::SnapHeapArgumentsInfo*,(TTD::NSSnapObjects::SnapObjectType)13>
                     (snpObject);
  if (pSVar2->IsFrameNullPtr == false) {
    if (pSVar2->FrameObject == 0) {
      TTDAbort_unrecoverable_error("That won\'t work!");
    }
    pRVar3 = InflateMap::LookupObject(inflator,pSVar2->FrameObject);
  }
  else {
    pRVar3 = (RecyclableObject *)0x0;
  }
  pRVar3 = Js::JavascriptLibrary::CreateHeapArguments_TTD
                     ((pSVar1->super_ScriptContextBase).javascriptLibrary,pSVar2->NumOfArguments,
                      pSVar2->FormalCount,(ActivationObject *)pRVar3,pSVar2->DeletedArgFlags);
  return pRVar3;
}

Assistant:

Js::RecyclableObject* DoObjectInflation_SnapHeapArgumentsInfo(const SnapObject* snpObject, InflateMap* inflator)
        {
            Js::ScriptContext* ctx = inflator->LookupScriptContext(snpObject->SnapType->ScriptContextLogId);

            SnapHeapArgumentsInfo* argsInfo = SnapObjectGetAddtlInfoAs<SnapHeapArgumentsInfo*, SnapObjectType::SnapHeapArgumentsObject>(snpObject);

            Js::RecyclableObject* activationObj = nullptr;
            if(argsInfo->IsFrameNullPtr)
            {
                activationObj = nullptr;
            }
            else
            {
                TTDAssert(argsInfo->FrameObject != TTD_INVALID_PTR_ID, "That won't work!");

                activationObj = inflator->LookupObject(argsInfo->FrameObject);
            }

            return  ctx->GetLibrary()->CreateHeapArguments_TTD(argsInfo->NumOfArguments, argsInfo->FormalCount, static_cast<Js::ActivationObject*>(activationObj), argsInfo->DeletedArgFlags);
        }